

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

void __thiscall Hair_SamplingWeights_Test::TestBody(Hair_SamplingWeights_Test *this)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 *puVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  float fVar21;
  Float FVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 in_XMM9_Da;
  undefined4 in_XMM9_Db;
  undefined8 in_XMM9_Qb;
  Vector3f wo;
  Float avg;
  SampledWavelengths lambda_1;
  optional<pbrt::BSDFSample> bs;
  SampledWavelengths lambda;
  HairBxDF hair;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  float local_16c;
  ulong local_168;
  float local_15c;
  float local_158;
  float local_154;
  AssertHelper local_150;
  float local_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  undefined1 local_128 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120 [3];
  ulong local_108;
  ulong local_100;
  undefined1 *local_f8;
  ulong local_f0;
  optional<pbrt::BSDFSample> local_e8;
  SampledSpectrum local_b8;
  SampledWavelengths local_a0;
  HairBxDF local_80;
  
  pbrt::SampledWavelengths::SampleXYZ(&local_a0,0.5);
  uVar17 = 2;
  uVar11 = 3;
  local_f0 = 5;
  local_f8 = &DAT_5851f42d4c957f2e;
  local_134 = 0.5;
  local_138 = 0.33333334;
  local_13c = 0.2;
  local_140 = 0.14285715;
  local_144 = 0.09090909;
  local_148 = 0.07692308;
  local_15c = 0.1;
  local_108 = uVar11;
  local_100 = uVar17;
  do {
    local_158 = 0.4;
    do {
      uVar16 = 0;
      do {
        auVar20 = ZEXT816(0) << 0x40;
        if (uVar16 != 0) {
          fVar21 = 1.0;
          lVar13 = 0;
          uVar15 = uVar16;
          do {
            fVar21 = local_134 * fVar21;
            lVar13 = (lVar13 - uVar15 / uVar17) * uVar17 + uVar15;
            bVar19 = uVar17 <= uVar15;
            uVar15 = uVar15 / uVar17;
          } while (bVar19);
          auVar20._4_4_ = in_XMM9_Db;
          auVar20._0_4_ = in_XMM9_Da;
          auVar20._8_8_ = in_XMM9_Qb;
          auVar20 = vcvtusi2ss_avx512f(auVar20,lVar13);
          auVar20 = ZEXT416((uint)(fVar21 * auVar20._0_4_));
        }
        auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar20);
        local_16c = 0.0;
        auVar23._0_8_ = (double)auVar20._0_4_;
        auVar23._8_8_ = auVar20._8_8_;
        auVar20 = vfmadd132sd_fma(auVar23,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
        uVar3 = vcmpsd_avx512f(auVar20,ZEXT816(0xbfeffffde7210be9),1);
        bVar19 = (bool)((byte)uVar3 & 1);
        auVar20 = vminsd_avx(ZEXT816(0x3feffffde7210be9),auVar20);
        local_b8.values.values = (array<float,_4>)(ZEXT416(0) << 0x40);
        local_168 = uVar16;
        pbrt::HairBxDF::HairBxDF
                  (&local_80,
                   (float)(double)((ulong)bVar19 * -0x4010000218def417 +
                                  (ulong)!bVar19 * auVar20._0_8_),1.55,&local_b8,local_15c,local_158
                   ,0.0);
        auVar20 = ZEXT816(0) << 0x40;
        if (uVar16 != 0) {
          lVar13 = 0;
          fVar21 = 1.0;
          do {
            fVar21 = local_138 * fVar21;
            lVar13 = (lVar13 - uVar16 / uVar11) * uVar11 + uVar16;
            bVar19 = uVar11 <= uVar16;
            uVar16 = uVar16 / uVar11;
          } while (bVar19);
          auVar26._4_4_ = in_XMM9_Db;
          auVar26._0_4_ = in_XMM9_Da;
          auVar26._8_8_ = in_XMM9_Qb;
          auVar20 = vcvtusi2ss_avx512f(auVar26,lVar13);
          lVar13 = 0;
          fVar24 = 1.0;
          uVar16 = local_168;
          do {
            fVar24 = local_13c * fVar24;
            lVar13 = (lVar13 - uVar16 / local_f0) * local_f0 + uVar16;
            bVar19 = local_f0 <= uVar16;
            uVar16 = uVar16 / local_f0;
          } while (bVar19);
          auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)(fVar21 * auVar20._0_4_)));
          local_16c = auVar20._0_4_;
          auVar27._4_4_ = in_XMM9_Db;
          auVar27._0_4_ = in_XMM9_Da;
          auVar27._8_8_ = in_XMM9_Qb;
          auVar20 = vcvtusi2ss_avx512f(auVar27,lVar13);
          auVar20 = ZEXT416((uint)(fVar24 * auVar20._0_4_));
          uVar16 = local_168;
        }
        auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar20);
        local_130 = auVar20._0_4_ * 6.2831855;
        local_12c = cosf(local_130);
        fVar21 = sinf(local_130);
        auVar20 = ZEXT816(0) << 0x40;
        FVar22 = 0.0;
        auVar26 = ZEXT816(0) << 0x40;
        auVar27 = SUB6416(ZEXT464(0x3f800000),0);
        auVar23 = vfmadd132ss_fma(ZEXT416((uint)local_16c),auVar27,ZEXT416(0xc0000000));
        if (uVar16 != 0) {
          auVar25 = ZEXT1664(auVar27);
          lVar13 = 0;
          uVar16 = local_168;
          do {
            fVar24 = local_140 * auVar25._0_4_;
            auVar25 = ZEXT464((uint)fVar24);
            lVar13 = (lVar13 - uVar16 / 7) * 7 + uVar16;
            bVar19 = 6 < uVar16;
            uVar16 = uVar16 / 7;
          } while (bVar19);
          auVar4._4_4_ = in_XMM9_Db;
          auVar4._0_4_ = in_XMM9_Da;
          auVar4._8_8_ = in_XMM9_Qb;
          auVar20 = vcvtusi2ss_avx512f(auVar4,lVar13);
          lVar13 = 0;
          auVar25 = ZEXT1664(auVar27);
          uVar16 = local_168;
          do {
            fVar1 = local_144 * auVar25._0_4_;
            auVar25 = ZEXT464((uint)fVar1);
            lVar13 = (lVar13 - uVar16 / 0xb) * 0xb + uVar16;
            bVar19 = 10 < uVar16;
            uVar16 = uVar16 / 0xb;
          } while (bVar19);
          auVar6._4_4_ = in_XMM9_Db;
          auVar6._0_4_ = in_XMM9_Da;
          auVar6._8_8_ = in_XMM9_Qb;
          auVar4 = vcvtusi2ss_avx512f(auVar6,lVar13);
          lVar13 = 0;
          auVar25 = ZEXT1664(auVar27);
          uVar16 = local_168;
          do {
            fVar2 = local_148 * auVar25._0_4_;
            auVar25 = ZEXT464((uint)fVar2);
            lVar13 = (lVar13 - uVar16 / 0xd) * 0xd + uVar16;
            bVar19 = 0xc < uVar16;
            uVar16 = uVar16 / 0xd;
          } while (bVar19);
          auVar7._4_4_ = in_XMM9_Db;
          auVar7._0_4_ = in_XMM9_Da;
          auVar7._8_8_ = in_XMM9_Qb;
          auVar26 = vcvtusi2ss_avx512f(auVar7,lVar13);
          auVar26 = ZEXT416((uint)(fVar2 * auVar26._0_4_));
          auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)(fVar24 * auVar20._0_4_)));
          FVar22 = auVar20._0_4_;
          auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar1 * auVar4._0_4_)))
          ;
        }
        auVar27 = vfnmadd213ss_fma(auVar23,auVar23,auVar27);
        auVar26 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar26);
        auVar20 = vinsertps_avx(auVar20,auVar26,0x10);
        auVar26 = vmaxss_avx(auVar27,ZEXT816(0) << 0x40);
        auVar26 = vsqrtss_avx(auVar26,auVar26);
        auVar26 = vinsertps_avx(ZEXT416((uint)(auVar26._0_4_ * local_12c)),
                                ZEXT416((uint)(fVar21 * auVar26._0_4_)),0x10);
        wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar26._0_8_;
        wo.super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
        pbrt::HairBxDF::Sample_f(&local_e8,&local_80,wo,FVar22,(Point2f)auVar20._0_8_,Radiance,All);
        if (local_e8.set == true) {
          fVar21 = 0.0;
          iVar12 = 0;
          puVar18 = local_f8;
          do {
            uVar9 = (uint)((ulong)puVar18 >> 0x2d) ^ (uint)((ulong)puVar18 >> 0x1b);
            bVar10 = (byte)((ulong)puVar18 >> 0x3b);
            auVar8._4_4_ = in_XMM9_Db;
            auVar8._0_4_ = in_XMM9_Da;
            auVar8._8_8_ = in_XMM9_Qb;
            auVar20 = vcvtusi2ss_avx512f(auVar8,uVar9 >> bVar10 | uVar9 << 0x20 - bVar10);
            auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            local_16c = fVar21;
            pbrt::SampledWavelengths::SampleXYZ
                      ((SampledWavelengths *)local_128,(auVar20._0_4_ + (float)iVar12) / 20.0);
            if (local_e8.set == false) {
LAB_00245b73:
              pbrt::LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
            }
            FVar22 = pbrt::SampledSpectrum::y
                               ((SampledSpectrum *)&local_e8,(SampledWavelengths *)local_128);
            if (local_e8.set != true) goto LAB_00245b73;
            iVar12 = iVar12 + 1;
            auVar5._8_4_ = 0x7fffffff;
            auVar5._0_8_ = 0x7fffffff7fffffff;
            auVar5._12_4_ = 0x7fffffff;
            auVar20 = vandps_avx512vl(ZEXT416((uint)local_e8.optionalValue._24_4_),auVar5);
            puVar18 = (undefined1 *)((long)puVar18 * 0x5851f42d4c957f2d + 1);
            fVar21 = local_16c + (FVar22 * auVar20._0_4_) / (float)local_e8.optionalValue._28_4_;
          } while (iVar12 != 0x14);
          local_154 = fVar21 / 20.0;
          local_178.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DAT_3fefae147ae147ae;
          testing::internal::CmpHelperGT<float,double>
                    ((internal *)local_128,"avg","0.99",&local_154,(double *)&local_178);
          uVar17 = local_100;
          uVar11 = local_108;
          if (local_128[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_178);
            pcVar14 = "";
            if (local_120[0].ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar14 = ((local_120[0].ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                       ,0x2f2,pcVar14);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            if (local_178.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar19 = testing::internal::IsTrue(true);
              if ((bVar19) &&
                 (local_178.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_178.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_178.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DAT_3ff028f5c28f5c29;
          testing::internal::CmpHelperLT<float,double>
                    ((internal *)local_128,"avg","1.01",&local_154,(double *)&local_178);
          if (local_128[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_178);
            pcVar14 = "";
            if (local_120[0].ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar14 = ((local_120[0].ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                       ,0x2f3,pcVar14);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            if (local_178.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar19 = testing::internal::IsTrue(true);
              if ((bVar19) &&
                 (local_178.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_178.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        uVar16 = local_168 + 1;
      } while (uVar16 != 10000);
      local_158 = local_158 + 0.2;
    } while (local_158 < 1.0);
    local_15c = local_15c + 0.2;
    if (1.0 <= local_15c) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Hair, SamplingWeights) {
    RNG rng;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);
    for (Float beta_m = .1; beta_m < 1; beta_m += .2)
        for (Float beta_n = .4; beta_n < 1; beta_n += .2) {
            int count = 10000;
            for (int i = 0; i < count; ++i) {
                Float h = Clamp(-1 + 2. * RadicalInverse(0, i), -.999999, .999999);

                // Check _HairBxDF::Sample\_f()_ sample weight
                SampledSpectrum sigma_a(0.);
                HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);

                Vector3f wo =
                    SampleUniformSphere({RadicalInverse(1, i), RadicalInverse(2, i)});
                Float uc = RadicalInverse(3, i);
                Point2f u = {RadicalInverse(4, i), RadicalInverse(5, i)};
                pstd::optional<BSDFSample> bs = hair.Sample_f(wo, uc, u, TransportMode::Radiance,
                                                              BxDFReflTransFlags::All);
                if (bs) {
                    Float sum = 0;
                    int ny = 20;
                    for (Float u : Stratified1D(ny)) {
                        SampledWavelengths lambda = SampledWavelengths::SampleXYZ(u);
                        sum += bs->f.y(lambda) * AbsCosTheta(bs->wi) / bs->pdf;
                    }

                    // Verify that hair BSDF sample weight is close to 1 for
                    // _wi_
                    Float avg = sum / ny;
                    EXPECT_GT(avg, 0.99);
                    EXPECT_LT(avg, 1.01);
                }
            }
        }
}